

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::
Data<QHashPrivate::Node<QFontEngineFT::GlyphAndSubPixelPosition,_QFontEngine::Glyph_*>_>::Data
          (Data<QHashPrivate::Node<QFontEngineFT::GlyphAndSubPixelPosition,_QFontEngine::Glyph_*>_>
           *this,Data<QHashPrivate::Node<QFontEngineFT::GlyphAndSubPixelPosition,_QFontEngine::Glyph_*>_>
                 *other)

{
  Entry *pEVar1;
  Span *pSVar2;
  Entry *pEVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ulong uVar6;
  Node<QFontEngineFT::GlyphAndSubPixelPosition,_QFontEngine::Glyph_*> *pNVar7;
  long lVar8;
  size_t sVar9;
  size_t sVar10;
  long in_FS_OFFSET;
  R RVar11;
  Bucket local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar9 = other->numBuckets;
  sVar10 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar10;
  this->spans = (Span *)0x0;
  RVar11 = allocateSpans(sVar9);
  this->spans = (Span *)RVar11.spans;
  lVar8 = 0;
  for (sVar9 = 0; sVar9 != RVar11.nSpans; sVar9 = sVar9 + 1) {
    pSVar2 = other->spans;
    for (sVar10 = 0; sVar10 != 0x80; sVar10 = sVar10 + 1) {
      uVar6 = (ulong)pSVar2->offsets[sVar10 + lVar8];
      if (uVar6 != 0xff) {
        pEVar3 = pSVar2[sVar9].entries;
        local_48.span = this->spans + sVar9;
        local_48.index = sVar10;
        pNVar7 = Bucket::insert(&local_48);
        pEVar1 = pEVar3 + uVar6;
        uVar4 = *(undefined8 *)(pEVar1->storage).data;
        uVar5 = *(undefined8 *)((pEVar1->storage).data + 8);
        (pNVar7->key).glyph = (int)uVar4;
        (pNVar7->key).subPixelPosition.x = (QFixed)(int)((ulong)uVar4 >> 0x20);
        *(undefined8 *)&(pNVar7->key).subPixelPosition.y = uVar5;
        pNVar7->value = *(Glyph **)(pEVar3[uVar6].storage.data + 0x10);
      }
    }
    lVar8 = lVar8 + 0x90;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }